

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::anon_unknown_0::MessageContainsExtensions
               (Descriptor *message)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (*(int *)(message + 0x78) < 1) {
    uVar1 = *(uint *)(message + 0x48);
    lVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    uVar3 = 0;
    do {
      if (uVar5 == uVar3) {
        return (long)uVar3 < (long)(int)uVar1;
      }
      bVar2 = MessageContainsExtensions((Descriptor *)(*(long *)(message + 0x50) + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0xa8;
    } while (!bVar2);
  }
  return true;
}

Assistant:

bool MessageContainsExtensions(const Descriptor* message) {
  if (message->extension_count() > 0) {
    return true;
  }
  for (int i = 0; i < message->nested_type_count(); i++) {
    if (MessageContainsExtensions(message->nested_type(i))) {
      return true;
    }
  }
  return false;
}